

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# common.c
# Opt level: O2

int error(char *cp)

{
  int iVar1;
  uint uVar2;
  LispPTR LVar3;
  FILE *pFVar4;
  char *pcVar5;
  
  iVar1 = device_before_raid();
  if (iVar1 < 0) {
    fwrite("Can\'t Enter URAID.\n",0x13,1,_stderr);
  }
  else {
    URaid_errmess = cp;
    fprintf(_stderr,"\n*Error* %s\n",cp);
    fflush(_stdin);
    fwrite("Enter the URaid\n",0x10,1,_stderr);
    print(Uraid_mess);
    putchar(10);
    fflush(_stdout);
    fflush(_stderr);
    URaid_currentFX = 0x7d1;
    memset(URaid_FXarray,0,8000);
    iVar1 = fileno(_stdin);
    uVar2 = fcntl(iVar1,3,0);
    if ((uVar2 & 0xfffffffd) != 0) {
      pFVar4 = freopen("/dev/tty","r",_stdin);
      if (pFVar4 == (FILE *)0x0) {
        perror("Reopen of stdin failed.");
        exit(0);
      }
    }
    while( true ) {
      do {
        do {
          iVar1 = _setjmp((__jmp_buf_tag *)BT_jumpbuf);
        } while (iVar1 == 1);
        iVar1 = _setjmp((__jmp_buf_tag *)SD_jumpbuf);
      } while (iVar1 == 1);
      while( true ) {
        uraid_commclear();
        BT_temp = 0;
        printf("\n< ");
        pcVar5 = URaid_inputstring;
        do {
          iVar1 = getchar();
          *pcVar5 = (char)iVar1;
          pcVar5 = pcVar5 + 1;
        } while ((char)iVar1 != '\n');
        URaid_argnum = __isoc99_sscanf(URaid_inputstring,"%1s%s%s",URaid_comm,URaid_arg1,URaid_arg2)
        ;
        LVar3 = uraid_commands();
        if (LVar3 == 0) break;
        fflush(_stdout);
        fflush(_stderr);
      }
      iVar1 = device_after_raid();
      if (-1 < iVar1) {
        return 0;
      }
      printf("Can\'t return to Lisp. Return to UNIX?");
      uVar2 = getchar();
      if ((uVar2 & 0xffffffdf) == 0x59) break;
      fflush(_stdin);
    }
  }
  exit(-1);
}

Assistant:

int error(const char *cp) {
  char *ptr;
  if (device_before_raid() < 0) {
    (void)fprintf(stderr, "Can't Enter URAID.\n");
    exit(-1);
  }
  /* comm read */
  URaid_errmess = cp;
  (void)fprintf(stderr, "\n*Error* %s\n", cp);
  fflush(stdin);
  (void)fprintf(stderr, "Enter the URaid\n");
  print(Uraid_mess);
  putchar('\n');
  /* XXX: make sure output is flushed so we can see where we are */
  fflush(stdout); fflush(stderr);
  URaid_currentFX = URMAXFXNUM + 1;
  memset(URaid_FXarray, 0, URMAXFXNUM * 4);
#ifndef DOS
  {
    int stat = fcntl(fileno(stdin), F_GETFL, 0);
    if (stat != O_RDONLY && stat != O_RDWR)
      if (freopen("/dev/tty", "r", stdin) == NULL) {
        perror("Reopen of stdin failed.");
        exit(0);
      }
  }
#endif /* DOS */
uraidloop:
  if (setjmp(BT_jumpbuf) == 1) goto uraidloop;
  if (setjmp(SD_jumpbuf) == 1) goto uraidloop;
  for (;;) { /* URAID LOOP */

    uraid_commclear();
    BT_temp = 0; /* So we get the "more" option on screen-full */
    printf("\n< ");
    for (ptr = URaid_inputstring; (*ptr = getchar()) != '\n'; ptr++) {}
    URaid_argnum = sscanf(URaid_inputstring, "%1s%s%s", URaid_comm, URaid_arg1, URaid_arg2);

    if (uraid_commands() == NIL) break;
    /* XXX: make sure output is flushed so we can see where we are */
    fflush(stdout); fflush(stderr);
  } /* for end */

  /**TopOfStack = NIL;if error is called from subr TOS will be set NIL**/
  if (device_after_raid() < 0) {
    printf("Can't return to Lisp. Return to UNIX?");
    {
      int c;
      c = getchar();
      if ((c == 'Y') || (c == 'y')) exit(-1);
    }
    fflush(stdin);
    goto uraidloop;
  }
  return (0);
}